

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddNumberError(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                 *this,ValidateErrorCode code,ValueType *actual,SValue *expected,
                _func_ValueType_ptr *exclusive)

{
  ValueType *this_00;
  StringRefType *pSVar1;
  CrtAllocator *pCVar2;
  ValueType *rhs;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  this_00 = &this->currentError_;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(this_00);
  (this->currentError_).data_.n = (Number)0x0;
  (this->currentError_).data_.s.str = (Ch *)0x0;
  (this->currentError_).data_.f.flags = 3;
  pSVar1 = GetActualString();
  local_40.s = pSVar1->s;
  local_40.length = pSVar1->length;
  pCVar2 = this->stateAllocator_;
  if (pCVar2 == (CrtAllocator *)0x0) {
    pCVar2 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar2;
    this->stateAllocator_ = pCVar2;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (this_00,&local_40,actual,pCVar2);
  pSVar1 = GetExpectedString();
  local_50.s = pSVar1->s;
  local_50.length = pSVar1->length;
  pCVar2 = this->stateAllocator_;
  if (pCVar2 == (CrtAllocator *)0x0) {
    pCVar2 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar2;
    this->stateAllocator_ = pCVar2;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  GenericValue<rapidjson::CrtAllocator>(&local_60,expected,pCVar2,false);
  pCVar2 = this->stateAllocator_;
  if (pCVar2 == (CrtAllocator *)0x0) {
    pCVar2 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar2;
    this->stateAllocator_ = pCVar2;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (this_00,&local_50,&local_60,pCVar2);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_60);
  if (exclusive != (_func_ValueType_ptr *)0x0) {
    rhs = (*exclusive)();
    pCVar2 = this->stateAllocator_;
    if (pCVar2 == (CrtAllocator *)0x0) {
      pCVar2 = (CrtAllocator *)operator_new(1);
      this->ownStateAllocator_ = pCVar2;
      this->stateAllocator_ = pCVar2;
    }
    GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
    GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)&local_60,rhs,pCVar2,
               false);
    pCVar2 = this->stateAllocator_;
    if (pCVar2 == (CrtAllocator *)0x0) {
      pCVar2 = (CrtAllocator *)operator_new(1);
      this->ownStateAllocator_ = pCVar2;
      this->stateAllocator_ = pCVar2;
    }
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember<bool>
              (this_00,&local_60,true,pCVar2);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_60);
  }
  AddCurrentError(this,code,false);
  return;
}

Assistant:

void AddNumberError(const ValidateErrorCode code, ValueType& actual, const SValue& expected,
        const typename SchemaType::ValueType& (*exclusive)() = 0) {
        currentError_.SetObject();
        currentError_.AddMember(GetActualString(), actual, GetStateAllocator());
        currentError_.AddMember(GetExpectedString(), ValueType(expected, GetStateAllocator()).Move(), GetStateAllocator());
        if (exclusive)
            currentError_.AddMember(ValueType(exclusive(), GetStateAllocator()).Move(), true, GetStateAllocator());
        AddCurrentError(code);
    }